

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void rol_36(void)

{
  ubyte uVar1;
  ubyte uVar2;
  ubyte oldcar;
  
  uVar1 = carry_f;
  except = '\0';
  uVar2 = getbyte(pc);
  temp2 = uVar2 + x_reg;
  carry_f = RAM[temp2] & 0x80;
  result_f = RAM[temp2] * '\x02';
  if (uVar1 != '\0') {
    result_f = result_f + '\x01';
  }
  RAM[temp2] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void rol_36(void) {
    ubyte oldcar;
    CLE;
    oldcar = carry_f;

    result_f = RAM[temp2 = getbyte(pc) + x_reg];
    carry_f = result_f & 0x80;
    result_f <<= 1;

    if (oldcar) result_f++;

    RAM[temp2] = result_f;
    pc++;
}